

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

void __thiscall csv::internals::MmapParser::next(MmapParser *this,size_t bytes)

{
  size_type offset;
  bool bVar1;
  unsigned_long *puVar2;
  element_type *peVar3;
  size_type *psVar4;
  const_pointer __str;
  size_type __len;
  size_t sVar5;
  RawCSVDataPtr *this_00;
  error_code *in_R9;
  size_t remainder;
  CSVRow local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_mmap<(mio::access_mode)0,_char> *local_80;
  basic_mmap_source<char> *mmap_ptr;
  mmap_source local_68;
  undefined1 local_48 [24];
  error_code error;
  size_t length;
  size_t bytes_local;
  MmapParser *this_local;
  
  (this->super_IBasicCSVParser).field_start = -1;
  (this->super_IBasicCSVParser).field_length = 0;
  length = bytes;
  bytes_local = (size_t)this;
  IBasicCSVParser::reset_data_ptr(&this->super_IBasicCSVParser);
  error._M_cat = (error_category *)((this->super_IBasicCSVParser).source_size - this->mmap_pos);
  puVar2 = std::min<unsigned_long>((unsigned_long *)&error._M_cat,&length);
  offset = *puVar2;
  std::error_code::error_code((error_code *)(local_48 + 0x10));
  mio::make_mmap_source<std::__cxx11::string>
            (&local_68,(mio *)&this->_filename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->mmap_pos,
             offset,(size_type)(local_48 + 0x10),in_R9);
  std::
  make_shared<mio::basic_mmap<(mio::access_mode)0,char>,mio::basic_mmap<(mio::access_mode)0,char>>
            ((basic_mmap<(mio::access_mode)0,_char> *)local_48);
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_IBasicCSVParser).data_ptr);
  std::shared_ptr<void>::operator=
            (&peVar3->_data,(shared_ptr<mio::basic_mmap<(mio::access_mode)0,_char>_> *)local_48);
  std::shared_ptr<mio::basic_mmap<(mio::access_mode)0,_char>_>::~shared_ptr
            ((shared_ptr<mio::basic_mmap<(mio::access_mode)0,_char>_> *)local_48);
  mio::basic_mmap<(mio::access_mode)0,_char>::~basic_mmap(&local_68);
  this->mmap_pos = offset + this->mmap_pos;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)(local_48 + 0x10));
  if (!bVar1) {
    this_00 = &(this->super_IBasicCSVParser).data_ptr;
    peVar3 = std::
             __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    local_80 = (basic_mmap<(mio::access_mode)0,_char> *)
               std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)peVar3);
    __str = mio::basic_mmap<(mio::access_mode)0,_char>::data(local_80);
    __len = mio::basic_mmap<(mio::access_mode)0,_char>::length(local_80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,__str,__len);
    peVar3 = std::
             __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    (peVar3->data)._M_len = local_90._M_len;
    (peVar3->data)._M_str = local_90._M_str;
    std::shared_ptr<csv::internals::RawCSVData>::shared_ptr
              ((shared_ptr<csv::internals::RawCSVData> *)&remainder,this_00);
    CSVRow::CSVRow(&local_b8,(shared_ptr<csv::internals::RawCSVData> *)&remainder);
    CSVRow::operator=(&(this->super_IBasicCSVParser).current_row,&local_b8);
    CSVRow::~CSVRow(&local_b8);
    std::shared_ptr<csv::internals::RawCSVData>::~shared_ptr
              ((shared_ptr<csv::internals::RawCSVData> *)&remainder);
    sVar5 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
    if ((this->mmap_pos == (this->super_IBasicCSVParser).source_size) ||
       (bVar1 = IBasicCSVParser::no_chunk(&this->super_IBasicCSVParser), bVar1)) {
      (this->super_IBasicCSVParser)._eof = true;
      IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
    }
    this->mmap_pos = this->mmap_pos - (offset - sVar5);
    return;
  }
  psVar4 = (size_type *)__cxa_allocate_exception(0x10);
  *psVar4 = local_48._16_8_;
  psVar4[1] = error._0_8_;
  __cxa_throw(psVar4,&std::error_code::typeinfo,0);
}

Assistant:

CSV_INLINE void MmapParser::next(size_t bytes = ITERATION_CHUNK_SIZE) {
            // Reset parser state
            this->field_start = UNINITIALIZED_FIELD;
            this->field_length = 0;
            this->reset_data_ptr();

            // Create memory map
            size_t length = std::min(this->source_size - this->mmap_pos, bytes);
            std::error_code error;
            this->data_ptr->_data = std::make_shared<mio::basic_mmap_source<char>>(mio::make_mmap_source(this->_filename, this->mmap_pos, length, error));
            this->mmap_pos += length;
            if (error) throw error;

            auto mmap_ptr = (mio::basic_mmap_source<char>*)(this->data_ptr->_data.get());

            // Create string view
            this->data_ptr->data = csv::string_view(mmap_ptr->data(), mmap_ptr->length());

            // Parse
            this->current_row = CSVRow(this->data_ptr);
            size_t remainder = this->parse();            

            if (this->mmap_pos == this->source_size || no_chunk()) {
                this->_eof = true;
                this->end_feed();
            }

            this->mmap_pos -= (length - remainder);
        }